

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O3

void ktxTexture_destruct(ktxTexture *This)

{
  long lVar1;
  ktxStream *pkVar2;
  undefined8 *puVar3;
  ktxStream stream;
  undefined8 local_70 [6];
  code *local_40;
  long local_30;
  
  pkVar2 = &This->_protected->_stream;
  puVar3 = local_70;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = pkVar2->read;
    pkVar2 = (ktxStream *)&pkVar2->skip;
    puVar3 = puVar3 + 1;
  }
  if (local_30 != 0) {
    (*local_40)();
  }
  if (This->kvDataHead != (ktxHashList)0x0) {
    ktxHashList_Destruct(&This->kvDataHead);
  }
  if (This->kvData != (ktx_uint8_t *)0x0) {
    free(This->kvData);
  }
  if (This->pData != (ktx_uint8_t *)0x0) {
    free(This->pData);
  }
  free(This->_protected);
  return;
}

Assistant:

void
ktxTexture_destruct(ktxTexture* This)
{
    ktxStream stream = *(ktxTexture_getStream(This));

    if (stream.data.file != NULL)
        stream.destruct(&stream);
    if (This->kvDataHead != NULL)
        ktxHashList_Destruct(&This->kvDataHead);
    if (This->kvData != NULL)
        free(This->kvData);
    if (This->pData != NULL)
        free(This->pData);
    free(This->_protected);
}